

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::TypePrinter::printHeapTypeName(TypePrinter *this,HeapType type)

{
  TypeNames local_60;
  
  if (type.id < 0x7d) {
    print(this,type);
    return;
  }
  std::function<wasm::TypeNames_(wasm::HeapType)>::operator()(&local_60,&this->generator,type);
  Name::print(&local_60.name,this->os);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60.fieldNames._M_h);
  return;
}

Assistant:

void TypePrinter::printHeapTypeName(HeapType type) {
  if (type.isBasic()) {
    print(type);
    return;
  }
  generator(type).name.print(os);
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
}